

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  bool bVar1;
  char *pcVar2;
  string *in_RDI;
  string *this;
  allocator<char> local_17a;
  allocator<char> local_179;
  FilePath output_name;
  FilePath local_158;
  FilePath result;
  FilePath local_118;
  string format;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string s;
  
  std::__cxx11::string::string
            ((string *)&s,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             FLAGS_gtest_output_abi_cxx11_);
  GetOutputFormat_abi_cxx11_();
  if (format._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output_name,"xml",(allocator<char> *)&result);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&format,&output_name.pathname_);
    std::__cxx11::string::~string((string *)&output_name.pathname_);
  }
  pcVar2 = strchr(s._M_dataplus._M_p,0x3a);
  if (pcVar2 == (char *)0x0) {
    UnitTest::GetInstance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
               _M_dataplus._M_p,(allocator<char> *)&local_118);
    FilePath::FilePath(&result,&local_58);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"test_detail",&local_17a)
    ;
    FilePath::FilePath(&local_158,&local_78);
    FilePath::MakeFileName(&output_name,&result,&local_158,0,format._M_dataplus._M_p);
    std::__cxx11::string::string((string *)in_RDI,&output_name.pathname_);
    std::__cxx11::string::~string((string *)&output_name);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&result);
    this = &local_58;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,pcVar2 + 1,(allocator<char> *)&result);
    FilePath::FilePath(&output_name,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    bVar1 = FilePath::IsAbsolutePath(&output_name);
    if (!bVar1) {
      UnitTest::GetInstance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                 _M_dataplus._M_p,&local_17a);
      FilePath::FilePath(&local_158,&local_b8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar2 + 1,&local_179);
      FilePath::FilePath(&local_118,&local_d8);
      FilePath::ConcatPaths(&result,&local_158,&local_118);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&output_name.pathname_,&result.pathname_);
      std::__cxx11::string::~string((string *)&result.pathname_);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    if ((output_name.pathname_._M_string_length == 0) ||
       (output_name.pathname_._M_dataplus._M_p[output_name.pathname_._M_string_length - 1] != '/'))
    {
      std::__cxx11::string::string((string *)in_RDI,&output_name.pathname_);
    }
    else {
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      FilePath::GenerateUniqueFileName
                (&result,&output_name,&local_158,local_118.pathname_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::string((string *)in_RDI,&result.pathname_);
      std::__cxx11::string::~string((string *)&result);
    }
    this = &output_name.pathname_;
  }
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::string::~string((string *)&format);
  std::__cxx11::string::~string((string *)&s);
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  std::string s = GTEST_FLAG_GET(output);
  const char* const gtest_output_flag = s.c_str();

  std::string format = GetOutputFormat();
  if (format.empty()) format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == nullptr)
    return internal::FilePath::MakeFileName(
               internal::FilePath(
                   UnitTest::GetInstance()->original_working_dir()),
               internal::FilePath(kDefaultOutputFile), 0, format.c_str())
        .string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory()) return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}